

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

bool __thiscall
cmMakefileTargetGenerator::CheckUseResponseFileForObjects(cmMakefileTargetGenerator *this,string *l)

{
  bool bVar1;
  long *plVar2;
  cmValue cVar3;
  size_t sVar4;
  size_type *psVar5;
  ulong uVar6;
  string *obj;
  char *extraout_RDX;
  pointer pbVar7;
  string_view value;
  string responseVar;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"CMAKE_",l);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_50.field_2._M_allocated_capacity = *psVar5;
    local_50.field_2._8_8_ = plVar2[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar5;
    local_50._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_50._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  cVar3 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_50);
  if ((cVar3.Value == (string *)0x0) ||
     ((cmValue *)(cVar3.Value)->_M_string_length == (cmValue *)0x0)) {
    sVar4 = cmSystemTools::CalculateCommandLineLengthLimit();
    if (sVar4 != 0) {
      uVar6 = 0;
      for (pbVar7 = (this->Objects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar7 != (this->Objects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        uVar6 = uVar6 + pbVar7->_M_string_length + 3;
      }
      for (pbVar7 = (this->ExternalObjects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar7 != (this->ExternalObjects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        uVar6 = uVar6 + pbVar7->_M_string_length + 3;
      }
      bVar1 = true;
      if (sVar4 >> 1 < uVar6) goto LAB_005379fb;
    }
    bVar1 = false;
  }
  else {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value);
  }
LAB_005379fb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmMakefileTargetGenerator::CheckUseResponseFileForObjects(
  std::string const& l) const
{
  // Check for an explicit setting one way or the other.
  std::string const responseVar =
    "CMAKE_" + l + "_USE_RESPONSE_FILE_FOR_OBJECTS";
  if (cmValue val = this->Makefile->GetDefinition(responseVar)) {
    if (!val->empty()) {
      return val.IsOn();
    }
  }

  // Check for a system limit.
  if (size_t const limit = cmSystemTools::CalculateCommandLineLengthLimit()) {
    // Compute the total length of our list of object files with room
    // for argument separation and quoting.  This does not convert paths
    // relative to CMAKE_CURRENT_BINARY_DIR like the final list will be, so
    // the actual list will likely be much shorter than this.  However, in
    // the worst case all objects will remain as absolute paths.
    size_t length = 0;
    for (std::string const& obj : this->Objects) {
      length += obj.size() + 3;
    }
    for (std::string const& ext_obj : this->ExternalObjects) {
      length += ext_obj.size() + 3;
    }

    // We need to guarantee room for both objects and libraries, so
    // if the objects take up more than half then use a response file
    // for them.
    if (length > (limit / 2)) {
      return true;
    }
  }

  // We do not need a response file for objects.
  return false;
}